

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# descriptor.pb.cc
# Opt level: O1

void __thiscall google::protobuf::SourceCodeInfo::MergeFrom(SourceCodeInfo *this,Message *from)

{
  LogMessage *other;
  SourceCodeInfo *from_00;
  LogFinisher local_51;
  LogMessage local_50;
  
  if ((SourceCodeInfo *)from == this) {
    internal::LogMessage::LogMessage
              (&local_50,LOGLEVEL_DFATAL,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/chai2010[P]protorpc/src/google/protobuf/descriptor.pb.cc"
               ,0x1f99);
    other = internal::LogMessage::operator<<(&local_50,"CHECK failed: (&from) != (this): ");
    internal::LogFinisher::operator=(&local_51,other);
    internal::LogMessage::~LogMessage(&local_50);
  }
  from_00 = (SourceCodeInfo *)__dynamic_cast(from,&Message::typeinfo,&typeinfo,0);
  if (from_00 == (SourceCodeInfo *)0x0) {
    internal::ReflectionOps::Merge(from,&this->super_Message);
  }
  else {
    MergeFrom(this,from_00);
  }
  return;
}

Assistant:

void SourceCodeInfo::MergeFrom(const ::google::protobuf::Message& from) {
  GOOGLE_CHECK_NE(&from, this);
  const SourceCodeInfo* source =
    ::google::protobuf::internal::dynamic_cast_if_available<const SourceCodeInfo*>(
      &from);
  if (source == NULL) {
    ::google::protobuf::internal::ReflectionOps::Merge(from, this);
  } else {
    MergeFrom(*source);
  }
}